

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Crop_x86_avx512::forward
          (Crop_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  Mat *pMVar6;
  Mat *this_00;
  pointer pMVar7;
  void *pvVar8;
  long *plVar9;
  Allocator *pAVar10;
  long *plVar11;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined8 uVar31;
  int *piVar32;
  pointer pMVar33;
  undefined1 auVar34 [40];
  undefined1 auVar35 [64];
  int iVar36;
  long lVar37;
  int *piVar38;
  sbyte sVar39;
  int iVar40;
  uint uVar41;
  long lVar42;
  int q;
  int iVar43;
  int iVar44;
  undefined7 uVar45;
  undefined8 uVar46;
  ulong uVar47;
  int z;
  uint uVar48;
  ulong uVar49;
  long lVar50;
  int iVar51;
  bool bVar52;
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  int _outw;
  int _outh;
  int _woffset;
  uint local_1e4;
  int _outc;
  int _hoffset;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blob_shapes;
  int iStack_1b0;
  int iStack_1ac;
  int iStack_1a8;
  int iStack_1a4;
  Mat m_1;
  int _outd;
  int local_120;
  int local_11c;
  Option *local_118;
  int _coffset;
  size_t local_108;
  int _doffset;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_f8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_1e4 = pMVar6->w;
  iVar36 = pMVar6->h;
  iVar40 = pMVar6->d;
  local_120 = pMVar6->c;
  iVar44 = pMVar6->dims;
  local_108 = pMVar6->elemsize;
  local_11c = pMVar6->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_118 = opt;
  local_f8 = bottom_blobs;
  if (((this->super_Crop).starts_expr._M_string_length != 0) &&
     ((this->super_Crop).ends_expr._M_string_length != 0)) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&bottom_blob_shapes,
               ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48,
               (allocator_type *)&m_1);
    lVar50 = 0;
    uVar47 = 0;
    while( true ) {
      pMVar33 = bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start;
      iVar43 = 1;
      uVar46 = 4;
      pMVar7 = (local_f8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar37 = (long)(local_f8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar7;
      lVar42 = lVar37 % 0x48;
      if ((ulong)(lVar37 / 0x48) <= uVar47) break;
      iVar51 = iVar43;
      switch(*(undefined4 *)((long)&pMVar7->dims + lVar50)) {
      case 1:
        uVar49 = (long)*(int *)((long)&pMVar7->elempack + lVar50) *
                 (long)*(int *)((long)&pMVar7->w + lVar50);
        auVar54._8_4_ = 1;
        auVar54._0_8_ = 0x100000001;
        auVar54._12_4_ = 1;
        auVar54 = vpinsrd_avx(auVar54,(int)uVar49,1);
        break;
      case 2:
        iVar2 = *(int *)((long)&pMVar7->w + lVar50);
        lVar42 = (long)*(int *)((long)&pMVar7->h + lVar50);
        lVar37 = *(int *)((long)&pMVar7->elempack + lVar50) * lVar42;
        auVar54 = vpinsrd_avx(ZEXT416(2),iVar2,1);
        auVar54 = vpinsrd_avx(auVar54,(int)lVar37,2);
        auVar54 = vpinsrd_avx(auVar54,1,3);
        uVar49 = lVar37 * iVar2;
        break;
      case 3:
        iVar2 = *(int *)((long)&pMVar7->w + lVar50);
        iVar3 = *(int *)((long)&pMVar7->h + lVar50);
        iVar51 = *(int *)((long)&pMVar7->elempack + lVar50) * *(int *)((long)&pMVar7->c + lVar50);
        auVar54 = vpinsrd_avx(ZEXT416(3),iVar2,1);
        auVar54 = vpinsrd_avx(auVar54,iVar3,2);
        auVar54 = vpinsrd_avx(auVar54,1,3);
        lVar37 = (long)iVar3 * (long)iVar2;
        goto LAB_00255e8f;
      case 4:
        iVar2 = *(int *)((long)&pMVar7->w + lVar50);
        iVar3 = *(int *)((long)&pMVar7->h + lVar50);
        iVar4 = *(int *)((long)&pMVar7->d + lVar50);
        lVar42 = (long)iVar4;
        iVar51 = *(int *)((long)&pMVar7->elempack + lVar50) * *(int *)((long)&pMVar7->c + lVar50);
        auVar54 = vpinsrd_avx(ZEXT416(4),iVar2,1);
        auVar54 = vpinsrd_avx(auVar54,iVar3,2);
        auVar54 = vpinsrd_avx(auVar54,iVar4,3);
        lVar37 = (long)iVar3 * (long)iVar2 * lVar42;
LAB_00255e8f:
        uVar49 = lVar37 + 3U & 0x3ffffffffffffffc;
        break;
      default:
        auVar54 = (undefined1  [16])0x0;
        uVar49 = 0;
        uVar46 = 0;
        iVar43 = 0;
        iVar51 = 0;
      }
      piVar38 = *(int **)((long)&(bottom_blob_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_start)->refcount + lVar50);
      if (piVar38 != (int *)0x0) {
        LOCK();
        *piVar38 = *piVar38 + -1;
        UNLOCK();
        if (*piVar38 == 0) {
          pvVar8 = *(void **)((long)&(bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->data + lVar50);
          plVar9 = *(long **)((long)&(bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->allocator + lVar50)
          ;
          if (plVar9 == (long *)0x0) {
            free(pvVar8);
          }
          else {
            (**(code **)(*plVar9 + 0x18))(plVar9,pvVar8,lVar42);
          }
        }
      }
      puVar1 = (undefined8 *)((long)&pMVar33->data + lVar50);
      *(undefined8 *)((long)&pMVar33->cstep + lVar50) = 0;
      *(undefined8 *)((long)puVar1 + 0xc) = 0;
      *(undefined8 *)((long)puVar1 + 0x14) = 0;
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&pMVar33->data + lVar50);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pMVar33->elemsize + lVar50) = uVar46;
      *(int *)((long)&pMVar33->elempack + lVar50) = iVar43;
      *(undefined8 *)((long)&pMVar33->allocator + lVar50) = 0;
      *(undefined1 (*) [16])((long)&pMVar33->dims + lVar50) = auVar54;
      *(int *)((long)&pMVar33->c + lVar50) = iVar51;
      *(ulong *)((long)&pMVar33->cstep + lVar50) = uVar49;
      uVar47 = uVar47 + 1;
      lVar50 = lVar50 + 0x48;
    }
    piVar38 = &_doffset;
    Crop::eval_crop_expr
              (&this->super_Crop,&bottom_blob_shapes,&_woffset,&_hoffset,piVar38,&_coffset,&_outw,
               &_outh,&_outd,&_outc);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blob_shapes);
    goto LAB_002560b9;
  }
  if ((this->super_Crop).woffset != -0xe9) {
    switch(iVar44) {
    case 1:
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
      goto LAB_002565e1;
    case 2:
      break;
    case 3:
      break;
    case 4:
      break;
    default:
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_002565e1;
    }
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
LAB_002565e1:
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    uVar5 = m_1._60_4_;
    switch(pMVar6[1].dims) {
    case 1:
      m_1.cstep = (long)pMVar6[1].elempack * (long)pMVar6[1].w;
      m_1._0_24_ = ZEXT824(4) << 0x80;
      m_1.elempack = 1;
      m_1.allocator = (Allocator *)0x0;
      m_1.dims = 1;
      m_1.w = (int)m_1.cstep;
      m_1.h = 1;
      m_1.d = 1;
      m_1.c = 1;
      goto LAB_00256750;
    case 2:
      m_1._0_24_ = ZEXT824(4) << 0x80;
      m_1.elempack = 1;
      m_1.allocator = (Allocator *)0x0;
      lVar50 = (long)pMVar6[1].elempack * (long)pMVar6[1].h;
      m_1.dims = 2;
      m_1.w = pMVar6[1].w;
      m_1.h = (int)lVar50;
      m_1.d = 1;
      m_1.c = 1;
      m_1._0_64_ = CONCAT460(uVar5,m_1._0_60_);
      m_1.cstep = lVar50 * pMVar6[1].w;
      break;
    case 3:
      m_1._0_24_ = ZEXT824(4) << 0x80;
      m_1.elempack = 1;
      m_1.allocator = (Allocator *)0x0;
      m_1.dims = 3;
      m_1.w = pMVar6[1].w;
      m_1.h = pMVar6[1].h;
      m_1.d = 1;
      m_1.c = pMVar6[1].elempack * pMVar6[1].c;
      lVar50 = (long)pMVar6[1].h * (long)pMVar6[1].w;
      goto LAB_0025673f;
    case 4:
      m_1._0_24_ = ZEXT824(4) << 0x80;
      m_1.elempack = 1;
      m_1.allocator = (Allocator *)0x0;
      m_1.dims = 4;
      m_1.w = pMVar6[1].w;
      m_1.h = pMVar6[1].h;
      m_1.d = pMVar6[1].d;
      m_1.c = pMVar6[1].elempack * pMVar6[1].c;
      lVar50 = (long)pMVar6[1].h * (long)pMVar6[1].w * (long)pMVar6[1].d;
LAB_0025673f:
      m_1.cstep = lVar50 + 3U & 0x3ffffffffffffffc;
LAB_00256750:
      m_1.data = (void *)m_1.data;
      m_1.refcount = (int *)m_1.refcount;
      m_1.elemsize = m_1.elemsize;
      m_1.elempack = m_1.elempack;
      m_1._28_4_ = m_1._28_4_;
      m_1.allocator = (Allocator *)m_1.allocator;
      m_1.dims = m_1.dims;
      m_1.w = m_1.w;
      m_1.h = m_1.h;
      m_1.d = m_1.d;
      m_1.c = m_1.c;
      m_1._0_64_ = CONCAT460(uVar5,m_1._0_60_);
      break;
    default:
      m_1.cstep = 0;
      m_1._0_28_ = ZEXT1228((undefined1  [12])0x0);
      m_1._0_60_ = ZEXT3260((undefined1  [32])m_1._0_32_);
      m_1._0_64_ = CONCAT460(uVar5,m_1._0_60_);
    }
    piVar38 = &_hoffset;
    Crop::resolve_crop_roi
              (&this->super_Crop,(Mat *)&bottom_blob_shapes,&m_1,&_woffset,piVar38,&_doffset,
               &_coffset,&_outw,&_outh,&_outd,&_outc);
    if (m_1.refcount != (int *)0x0) {
      LOCK();
      *m_1.refcount = *m_1.refcount + -1;
      UNLOCK();
      if (*m_1.refcount == 0) {
        if (m_1.allocator == (Allocator *)0x0) {
          free(m_1.data);
        }
        else {
          (*(m_1.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar32 = (int *)CONCAT44(bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._4_4_,
                              bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._0_4_);
    if (piVar32 != (int *)0x0) {
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 != 0) goto LAB_002560b9;
      goto LAB_002572d6;
    }
    goto LAB_002560b9;
  }
  switch(iVar44) {
  case 1:
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
    goto LAB_0025652e;
  case 2:
    break;
  case 3:
    break;
  case 4:
    break;
  default:
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_0025652e;
  }
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
LAB_0025652e:
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  piVar38 = &_hoffset;
  Crop::resolve_crop_roi
            (&this->super_Crop,(Mat *)&bottom_blob_shapes,(int *)pMVar6[1].data,&_woffset,piVar38,
             &_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
  piVar32 = (int *)CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_,
                            bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_4_);
  if (piVar32 != (int *)0x0) {
    LOCK();
    *piVar32 = *piVar32 + -1;
    UNLOCK();
    if (*piVar32 == 0) {
LAB_002572d6:
      free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start);
    }
  }
LAB_002560b9:
  uVar45 = (undefined7)((ulong)piVar38 >> 8);
  if (local_11c == 4) {
    if (3 < iVar44 - 1U) goto switchD_002561a9_default;
    switch(iVar44) {
    case 1:
      uVar48 = _outw & 3;
      iVar36 = (uint)(uVar48 == 0) * 3 + 1;
      uVar49 = (long)_outw % (long)iVar36;
      if (local_1e4 != _outw / iVar36 || uVar48 != 0) {
        if (((_outw | _woffset) & 3U) == 0) {
          Mat::create(this_00,_outw / iVar36,(local_108 >> 2) << (uVar48 == 0) * '\x02',iVar36,
                      local_118->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            crop_pack4_sse(pMVar6,this_00,0,_woffset / 4);
            return 0;
          }
          return -100;
        }
        goto switchD_002561a9_default;
      }
      if (this_00 == pMVar6) {
        return 0;
      }
      piVar38 = pMVar6->refcount;
      if (piVar38 != (int *)0x0) {
        LOCK();
        *piVar38 = *piVar38 + 1;
        UNLOCK();
      }
      piVar38 = this_00->refcount;
      if (piVar38 == (int *)0x0) goto LAB_00257b6d;
      LOCK();
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if (*piVar38 != 0) goto LAB_00257b6d;
      pvVar8 = this_00->data;
      pAVar10 = this_00->allocator;
      goto joined_r0x0025623b;
    case 2:
      if (_outw == local_1e4) {
        iVar40 = (uint)((_outh & 3U) == 0) * 3 + 1;
        uVar49 = (long)_outh % (long)iVar40;
        if (((_outh & 3U) == 0) && (_outh / iVar40 == iVar36)) {
          if (this_00 == pMVar6) {
            return 0;
          }
          piVar38 = pMVar6->refcount;
          if (piVar38 != (int *)0x0) {
            LOCK();
            *piVar38 = *piVar38 + 1;
            UNLOCK();
          }
          piVar38 = this_00->refcount;
          if (piVar38 == (int *)0x0) goto LAB_00257b6d;
          LOCK();
          *piVar38 = *piVar38 + -1;
          UNLOCK();
          if (*piVar38 != 0) goto LAB_00257b6d;
          pvVar8 = this_00->data;
          pAVar10 = this_00->allocator;
joined_r0x00256d5f:
          uVar49 = uVar49 & 0xffffffff;
          goto joined_r0x0025623b;
        }
      }
      if (((_hoffset | _outh) & 3U) == 0) {
        Mat::create(this_00,_outw,_outh >> 2,(local_108 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                    local_118->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          crop_pack4_sse(pMVar6,this_00,_hoffset / 4,_woffset);
          return 0;
        }
        return -100;
      }
      goto switchD_002561a9_default;
    case 4:
      uVar48 = _outc & 3;
      uVar47 = local_108 >> 2;
      if (iVar40 == _outd && (iVar36 == _outh && local_1e4 == _outw)) {
        iVar44 = (uint)((_outc & 3U) == 0) * 3 + 1;
        uVar49 = (long)_outc % (long)iVar44;
        if (((_outc & 3U) == 0) && (_outc / iVar44 == local_120)) {
          if (this_00 == pMVar6) {
            return 0;
          }
          piVar38 = pMVar6->refcount;
          if (piVar38 != (int *)0x0) {
            LOCK();
            *piVar38 = *piVar38 + 1;
            UNLOCK();
          }
          piVar38 = this_00->refcount;
          if (piVar38 == (int *)0x0) goto LAB_00257b6d;
          LOCK();
          *piVar38 = *piVar38 + -1;
          UNLOCK();
          if (*piVar38 != 0) goto LAB_00257b6d;
          pvVar8 = this_00->data;
          pAVar10 = this_00->allocator;
          goto joined_r0x0025623b;
        }
      }
      if (((_coffset | _outc) & 3U) != 0) goto switchD_002561a9_default;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pMVar6->elemsize;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)(_coffset >> 2) * pMVar6->cstep *
                     (long)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + (long)pMVar6->data);
      iVar44 = pMVar6->elempack;
      pAVar10 = pMVar6->allocator;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      uVar23 = pMVar6->w;
      uVar24 = pMVar6->h;
      uVar49 = ((long)pMVar6->d *
                (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage *
                (long)pMVar6->h * (long)pMVar6->w + 0xfU & 0xfffffffffffffff0) /
               (ulong)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (iVar40 != _outd || (iVar36 != _outh || local_1e4 != _outw)) {
LAB_0025827d:
        Mat::create(this_00,_outw,_outh,_outd,_outc / 4,uVar47 << (uVar48 == 0) * '\x02',4,
                    local_118->blob_allocator);
        local_f8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0xffffffffffffff9c;
        if ((this_00->data != (void *)0x0) &&
           (uVar47 = (ulong)this_00->c, this_00->cstep * uVar47 != 0)) {
          local_f8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x0;
          for (lVar50 = 0; lVar50 < (int)uVar47; lVar50 = lVar50 + 1) {
            for (lVar37 = 0; auVar53 = (undefined1  [64])m_1._0_64_, lVar37 < _outd;
                lVar37 = lVar37 + 1) {
              m_1.cstep = (long)(int)uVar24 * (long)(int)uVar23;
              m_1.refcount = (int *)0x0;
              m_1.data = (void *)((long)&(bottom_blob_shapes.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->data +
                                 (long)(_doffset + (int)lVar37) *
                                 (long)bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage * m_1.cstep
                                 + uVar49 * lVar50 *
                                   (long)bottom_blob_shapes.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage);
              m_1.elemsize = (size_t)bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage;
              m_1._28_36_ = auVar53._28_36_;
              m_1.elempack = iVar44;
              m_1.allocator = pAVar10;
              m_1.dims = 2;
              m_1.w = uVar23;
              m_1.h = uVar24;
              m_1._60_4_ = auVar53._60_4_;
              m_1.d = 1;
              m_1.c = 1;
              bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_00->elemsize;
              bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)this_00->data +
                            (long)this_00->h *
                            (long)bottom_blobs_unpacked.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage * lVar37 * this_00->w +
                            this_00->cstep * lVar50 *
                            (long)bottom_blobs_unpacked.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
              bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              crop_pack4_sse(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
            }
            uVar47 = (ulong)(uint)this_00->c;
          }
        }
      }
      else {
        Mat::clone(&m_1,(__fn *)&bottom_blob_shapes,local_118->blob_allocator,_outd,
                   (void *)(ulong)(uint)_outh);
        piVar38 = m_1.refcount;
        auVar53 = (undefined1  [64])m_1._0_64_;
        if (this_00 != &m_1) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar38 = this_00->refcount;
          if (piVar38 != (int *)0x0) {
            LOCK();
            *piVar38 = *piVar38 + -1;
            UNLOCK();
            if (*piVar38 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                free(this_00->data);
              }
              else {
                (*this_00->allocator->_vptr_Allocator[3])();
              }
            }
          }
          auVar53 = (undefined1  [64])m_1._0_64_;
          this_00->data = m_1.data;
          this_00->refcount = m_1.refcount;
          this_00->elemsize = m_1.elemsize;
          this_00->elempack = m_1.elempack;
          this_00->allocator = m_1.allocator;
          this_00->dims = m_1.dims;
          this_00->w = m_1.w;
          this_00->h = m_1.h;
          this_00->d = m_1.d;
          m_1.c = auVar53._56_4_;
          this_00->c = m_1.c;
          this_00->cstep = m_1.cstep;
          piVar38 = m_1.refcount;
        }
        m_1._0_64_ = auVar53;
        if (piVar38 != (int *)0x0) {
          LOCK();
          *piVar38 = *piVar38 + -1;
          UNLOCK();
          if (*piVar38 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_f8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0xffffffffffffff9c;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0))
        goto LAB_0025827d;
      }
      piVar38 = (int *)CONCAT44(bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      iVar44 = (int)local_f8;
      if (piVar38 == (int *)0x0) {
        return iVar44;
      }
      LOCK();
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if (*piVar38 != 0) {
        return iVar44;
      }
      if (pAVar10 != (Allocator *)0x0) {
        (*pAVar10->_vptr_Allocator[3])();
        return iVar44;
      }
      goto LAB_00258d35;
    }
    uVar48 = _outc & 3;
    uVar47 = local_108 >> 2;
    bVar52 = iVar36 == _outh;
    bVar12 = local_1e4 == _outw;
    if (bVar52 && bVar12) {
      iVar36 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar49 = (long)_outc % (long)iVar36;
      if (((_outc & 3U) == 0) && (_outc / iVar36 == local_120)) {
        if (this_00 == pMVar6) {
          return 0;
        }
        piVar38 = pMVar6->refcount;
        if (piVar38 != (int *)0x0) {
          LOCK();
          *piVar38 = *piVar38 + 1;
          UNLOCK();
        }
        piVar38 = this_00->refcount;
        if (piVar38 == (int *)0x0) goto LAB_00257b6d;
        LOCK();
        *piVar38 = *piVar38 + -1;
        UNLOCK();
        if (*piVar38 != 0) goto LAB_00257b6d;
        pvVar8 = this_00->data;
        pAVar10 = this_00->allocator;
        goto joined_r0x0025623b;
      }
    }
    if (((_coffset | _outc) & 3U) != 0) goto switchD_002561a9_default;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pMVar6->elemsize;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)(_coffset >> 2) * pMVar6->cstep *
                   (long)bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + (long)pMVar6->data);
    iVar36 = pMVar6->elempack;
    pAVar10 = pMVar6->allocator;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    uVar19 = pMVar6->dims;
    uVar20 = pMVar6->w;
    uVar21 = pMVar6->h;
    uVar22 = pMVar6->d;
    uVar49 = ((long)pMVar6->d *
              (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage *
              (long)pMVar6->h * (long)pMVar6->w + 0xfU & 0xfffffffffffffff0) /
             (ulong)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (bVar52 && bVar12) {
      Mat::clone(&m_1,(__fn *)&bottom_blob_shapes,local_118->blob_allocator,_outh,
                 (void *)CONCAT71(uVar45,bVar52 && bVar12));
      piVar38 = m_1.refcount;
      auVar53 = (undefined1  [64])m_1._0_64_;
      if (this_00 != &m_1) {
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + 1;
          UNLOCK();
        }
        piVar38 = this_00->refcount;
        if (piVar38 != (int *)0x0) {
          LOCK();
          *piVar38 = *piVar38 + -1;
          UNLOCK();
          if (*piVar38 == 0) {
            if (this_00->allocator == (Allocator *)0x0) {
              free(this_00->data);
            }
            else {
              (*this_00->allocator->_vptr_Allocator[3])();
            }
          }
        }
        auVar53 = (undefined1  [64])m_1._0_64_;
        this_00->data = m_1.data;
        this_00->refcount = m_1.refcount;
        this_00->elemsize = m_1.elemsize;
        this_00->elempack = m_1.elempack;
        this_00->allocator = m_1.allocator;
        this_00->dims = m_1.dims;
        this_00->w = m_1.w;
        this_00->h = m_1.h;
        this_00->d = m_1.d;
        m_1.c = auVar53._56_4_;
        this_00->c = m_1.c;
        this_00->cstep = m_1.cstep;
        piVar38 = m_1.refcount;
      }
      m_1._0_64_ = auVar53;
      if (piVar38 != (int *)0x0) {
        LOCK();
        *piVar38 = *piVar38 + -1;
        UNLOCK();
        if (*piVar38 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar44 = -100;
      if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0))
      goto LAB_00257c91;
    }
    else {
LAB_00257c91:
      Mat::create(this_00,_outw,_outh,_outc / 4,uVar47 << (uVar48 == 0) * '\x02',4,
                  local_118->blob_allocator);
      iVar44 = -100;
      if ((this_00->data != (void *)0x0) &&
         (uVar47 = (ulong)this_00->c, this_00->cstep * uVar47 != 0)) {
        for (lVar50 = 0; auVar53 = (undefined1  [64])m_1._0_64_, lVar50 < (int)uVar47;
            lVar50 = lVar50 + 1) {
          m_1.refcount = (int *)0x0;
          m_1.data = (void **)((long)&(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->data +
                              uVar49 * lVar50 *
                              (long)bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          m_1.elemsize = (size_t)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage;
          m_1._28_36_ = auVar53._28_36_;
          m_1.elempack = iVar36;
          auVar35 = (undefined1  [64])m_1._0_64_;
          m_1._40_24_ = auVar53._40_24_;
          m_1._0_32_ = auVar35._0_32_;
          m_1.allocator = pAVar10;
          auVar34 = (undefined1  [40])m_1._0_40_;
          m_1.w = uVar20;
          m_1.h = uVar21;
          m_1.d = 1;
          m_1._60_4_ = auVar53._60_4_;
          m_1.c = uVar22;
          m_1.dims = uVar19 + -1;
          m_1._0_44_ = CONCAT440(m_1.dims,auVar34);
          m_1.cstep = ((long)bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage *
                       (long)(int)uVar21 * (long)(int)uVar20 + 0xfU & 0xfffffffffffffff0) /
                      (ulong)bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
          if (uVar19 == 4) {
            m_1.cstep = (long)(int)uVar21 * (long)(int)uVar20;
          }
          bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)this_00->elemsize;
          bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(this_00->cstep * lVar50 *
                         (long)bottom_blobs_unpacked.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + (long)this_00->data);
          bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          crop_pack4_sse(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
          uVar47 = (ulong)(uint)this_00->c;
        }
        iVar44 = 0;
      }
    }
    piVar38 = (int *)CONCAT44(bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._4_4_,
                              bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._0_4_);
    if (piVar38 == (int *)0x0) {
      return iVar44;
    }
    LOCK();
    *piVar38 = *piVar38 + -1;
    UNLOCK();
    if (*piVar38 != 0) {
      return iVar44;
    }
    if (pAVar10 != (Allocator *)0x0) {
      (*pAVar10->_vptr_Allocator[3])();
      return iVar44;
    }
    goto LAB_00258d35;
  }
  if (local_11c != 8) {
    if ((local_11c != 0x10) || (3 < iVar44 - 1U)) goto switchD_002561a9_default;
    switch(iVar44) {
    case 1:
      if ((_outw & 0xfU) == 0) {
        uVar48 = 0x10;
      }
      else if ((_outw & 7U) == 0) {
        uVar48 = 8;
      }
      else {
        uVar48 = (uint)((_outw & 3U) == 0) * 3 + 1;
      }
      uVar41 = uVar48 ^ 0x10 | local_1e4 ^ _outw / (int)uVar48;
      uVar49 = (ulong)uVar41;
      if (uVar41 != 0) {
        if ((uVar48 == 0x10) && ((_woffset & 0xfU) == 0)) {
          Mat::create(this_00,_outw / (int)uVar48,local_108 & 0xfffffffffffffff0,0x10,
                      local_118->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            crop_pack16_avx512(pMVar6,this_00,0,_woffset / 0x10);
            return 0;
          }
          return -100;
        }
        goto switchD_002561a9_default;
      }
      if (this_00 == pMVar6) {
        return 0;
      }
      piVar38 = pMVar6->refcount;
      if (piVar38 != (int *)0x0) {
        LOCK();
        *piVar38 = *piVar38 + 1;
        UNLOCK();
      }
      piVar38 = this_00->refcount;
      if (piVar38 == (int *)0x0) goto LAB_00257b6d;
      LOCK();
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if (*piVar38 != 0) goto LAB_00257b6d;
      pvVar8 = this_00->data;
      pAVar10 = this_00->allocator;
      goto joined_r0x0025623b;
    case 2:
      if ((_outh & 0xfU) == 0) {
        iVar40 = 0x10;
      }
      else if ((_outh & 7U) == 0) {
        iVar40 = 8;
      }
      else {
        iVar40 = (uint)((_outh & 3U) == 0) * 3 + 1;
      }
      if (_outw == local_1e4) {
        uVar49 = (long)_outh % (long)iVar40;
        if ((iVar40 == 0x10) && (_outh / iVar40 == iVar36)) {
          if (this_00 == pMVar6) {
            return 0;
          }
          piVar38 = pMVar6->refcount;
          if (piVar38 != (int *)0x0) {
            LOCK();
            *piVar38 = *piVar38 + 1;
            UNLOCK();
          }
          piVar38 = this_00->refcount;
          if (piVar38 == (int *)0x0) goto LAB_00257b6d;
          LOCK();
          *piVar38 = *piVar38 + -1;
          UNLOCK();
          if (*piVar38 != 0) goto LAB_00257b6d;
          pvVar8 = this_00->data;
          pAVar10 = this_00->allocator;
          goto joined_r0x00256d5f;
        }
      }
      if ((iVar40 == 0x10) && ((_hoffset & 0xfU) == 0)) {
        Mat::create(this_00,_outw,_outh / 0x10,local_108 & 0xfffffffffffffff0,0x10,
                    local_118->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          crop_pack16_avx512(pMVar6,this_00,_hoffset / 0x10,_woffset);
          return 0;
        }
        return -100;
      }
      goto switchD_002561a9_default;
    case 4:
      if ((_outc & 0xfU) == 0) {
        uVar48 = 0x10;
      }
      else if ((_outc & 7U) == 0) {
        uVar48 = 8;
      }
      else {
        uVar48 = (uint)((_outc & 3U) == 0) * 3 + 1;
      }
      if (iVar40 == _outd && (iVar36 == _outh && local_1e4 == _outw)) {
        uVar49 = (long)_outc % (long)(int)uVar48;
        if ((uVar48 == 0x10) && (_outc / (int)uVar48 == local_120)) {
          if (this_00 == pMVar6) {
            return 0;
          }
          piVar38 = pMVar6->refcount;
          if (piVar38 != (int *)0x0) {
            LOCK();
            *piVar38 = *piVar38 + 1;
            UNLOCK();
          }
          piVar38 = this_00->refcount;
          if (piVar38 == (int *)0x0) goto LAB_00257b6d;
          LOCK();
          *piVar38 = *piVar38 + -1;
          UNLOCK();
          if (*piVar38 != 0) goto LAB_00257b6d;
          pvVar8 = this_00->data;
          pAVar10 = this_00->allocator;
          goto joined_r0x0025623b;
        }
      }
      if (uVar48 != 0x10 || (_coffset & 0xfU) != 0) goto switchD_002561a9_default;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pMVar6->elemsize;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)(_coffset >> 4) * pMVar6->cstep *
                     (long)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + (long)pMVar6->data);
      iVar44 = -100;
      iVar43 = pMVar6->elempack;
      pAVar10 = pMVar6->allocator;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      uVar29 = pMVar6->w;
      uVar30 = pMVar6->h;
      uVar47 = ((long)pMVar6->d *
                (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage *
                (long)pMVar6->h * (long)pMVar6->w + 0xfU & 0xfffffffffffffff0) /
               (ulong)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (iVar40 != _outd || (iVar36 != _outh || local_1e4 != _outw)) {
LAB_00258571:
        Mat::create(this_00,_outw,_outh,_outd,_outc / 0x10,(ulong)uVar48 * (local_108 >> 4),0x10,
                    local_118->blob_allocator);
        if ((this_00->data != (void *)0x0) &&
           (uVar49 = (ulong)this_00->c, this_00->cstep * uVar49 != 0)) {
          for (lVar50 = 0; lVar50 < (int)uVar49; lVar50 = lVar50 + 1) {
            for (lVar37 = 0; auVar53 = (undefined1  [64])m_1._0_64_, lVar37 < _outd;
                lVar37 = lVar37 + 1) {
              m_1.cstep = (long)(int)uVar30 * (long)(int)uVar29;
              m_1.refcount = (int *)0x0;
              m_1.data = (void *)((long)&(bottom_blob_shapes.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->data +
                                 (long)(_doffset + (int)lVar37) *
                                 (long)bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage * m_1.cstep
                                 + uVar47 * lVar50 *
                                   (long)bottom_blob_shapes.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage);
              m_1.elemsize = (size_t)bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage;
              m_1._28_36_ = auVar53._28_36_;
              m_1.elempack = iVar43;
              m_1.allocator = pAVar10;
              m_1.dims = 2;
              m_1.w = uVar29;
              m_1.h = uVar30;
              m_1._60_4_ = auVar53._60_4_;
              m_1.d = 1;
              m_1.c = 1;
              bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_00->elemsize;
              bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)this_00->data +
                            lVar37 * (long)bottom_blobs_unpacked.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage *
                            (long)this_00->h * (long)this_00->w +
                            this_00->cstep * lVar50 *
                            (long)bottom_blobs_unpacked.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
              bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              crop_pack16_avx512(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
            }
            uVar49 = (ulong)(uint)this_00->c;
          }
          iVar44 = 0;
        }
      }
      else {
        Mat::clone(&m_1,(__fn *)&bottom_blob_shapes,local_118->blob_allocator,_outd,
                   (void *)(ulong)(uint)_outh);
        piVar38 = m_1.refcount;
        auVar53 = (undefined1  [64])m_1._0_64_;
        if (this_00 != &m_1) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar38 = this_00->refcount;
          if (piVar38 != (int *)0x0) {
            LOCK();
            *piVar38 = *piVar38 + -1;
            UNLOCK();
            if (*piVar38 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                free(this_00->data);
              }
              else {
                (*this_00->allocator->_vptr_Allocator[3])();
              }
            }
          }
          auVar53 = (undefined1  [64])m_1._0_64_;
          this_00->data = m_1.data;
          this_00->refcount = m_1.refcount;
          this_00->elemsize = m_1.elemsize;
          this_00->elempack = m_1.elempack;
          this_00->allocator = m_1.allocator;
          this_00->dims = m_1.dims;
          this_00->w = m_1.w;
          this_00->h = m_1.h;
          this_00->d = m_1.d;
          m_1.c = auVar53._56_4_;
          this_00->c = m_1.c;
          this_00->cstep = m_1.cstep;
          piVar38 = m_1.refcount;
        }
        m_1._0_64_ = auVar53;
        if (piVar38 != (int *)0x0) {
          LOCK();
          *piVar38 = *piVar38 + -1;
          UNLOCK();
          if (*piVar38 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0))
        goto LAB_00258571;
      }
      piVar38 = (int *)CONCAT44(bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar38 == (int *)0x0) {
        return iVar44;
      }
      LOCK();
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if (*piVar38 != 0) {
        return iVar44;
      }
      if (pAVar10 != (Allocator *)0x0) {
        (*pAVar10->_vptr_Allocator[3])();
        return iVar44;
      }
      goto LAB_00258d35;
    }
    if ((_outc & 0xfU) == 0) {
      uVar48 = 0x10;
    }
    else if ((_outc & 7U) == 0) {
      uVar48 = 8;
    }
    else {
      uVar48 = (uint)((_outc & 3U) == 0) * 3 + 1;
    }
    bVar52 = iVar36 == _outh;
    bVar12 = local_1e4 == _outw;
    if (bVar52 && bVar12) {
      uVar49 = (long)_outc % (long)(int)uVar48;
      if ((uVar48 == 0x10) && (_outc / (int)uVar48 == local_120)) {
        if (this_00 == pMVar6) {
          return 0;
        }
        piVar38 = pMVar6->refcount;
        if (piVar38 != (int *)0x0) {
          LOCK();
          *piVar38 = *piVar38 + 1;
          UNLOCK();
        }
        piVar38 = this_00->refcount;
        if (piVar38 == (int *)0x0) goto LAB_00257b6d;
        LOCK();
        *piVar38 = *piVar38 + -1;
        UNLOCK();
        if (*piVar38 != 0) goto LAB_00257b6d;
        pvVar8 = this_00->data;
        pAVar10 = this_00->allocator;
        goto joined_r0x0025623b;
      }
    }
    if (uVar48 != 0x10 || (_coffset & 0xfU) != 0) goto switchD_002561a9_default;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pMVar6->elemsize;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)(_coffset >> 4) * pMVar6->cstep *
                   (long)bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + (long)pMVar6->data);
    iVar36 = pMVar6->elempack;
    pAVar10 = pMVar6->allocator;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    uVar25 = pMVar6->dims;
    uVar26 = pMVar6->w;
    uVar27 = pMVar6->h;
    uVar28 = pMVar6->d;
    uVar47 = ((long)pMVar6->d *
              (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage *
              (long)pMVar6->h * (long)pMVar6->w + 0xfU & 0xfffffffffffffff0) /
             (ulong)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (bVar52 && bVar12) {
      Mat::clone(&m_1,(__fn *)&bottom_blob_shapes,local_118->blob_allocator,_outh,
                 (void *)CONCAT71(uVar45,bVar52 && bVar12));
      piVar38 = m_1.refcount;
      auVar53 = (undefined1  [64])m_1._0_64_;
      if (this_00 != &m_1) {
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + 1;
          UNLOCK();
        }
        piVar38 = this_00->refcount;
        if (piVar38 != (int *)0x0) {
          LOCK();
          *piVar38 = *piVar38 + -1;
          UNLOCK();
          if (*piVar38 == 0) {
            if (this_00->allocator == (Allocator *)0x0) {
              free(this_00->data);
            }
            else {
              (*this_00->allocator->_vptr_Allocator[3])();
            }
          }
        }
        auVar53 = (undefined1  [64])m_1._0_64_;
        this_00->data = m_1.data;
        this_00->refcount = m_1.refcount;
        this_00->elemsize = m_1.elemsize;
        this_00->elempack = m_1.elempack;
        this_00->allocator = m_1.allocator;
        this_00->dims = m_1.dims;
        this_00->w = m_1.w;
        this_00->h = m_1.h;
        this_00->d = m_1.d;
        m_1.c = auVar53._56_4_;
        this_00->c = m_1.c;
        this_00->cstep = m_1.cstep;
        piVar38 = m_1.refcount;
      }
      m_1._0_64_ = auVar53;
      if (piVar38 != (int *)0x0) {
        LOCK();
        *piVar38 = *piVar38 + -1;
        UNLOCK();
        if (*piVar38 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar44 = -100;
      if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0))
      goto LAB_00257f7d;
    }
    else {
LAB_00257f7d:
      Mat::create(this_00,_outw,_outh,_outc / 0x10,(ulong)uVar48 * (local_108 >> 4),0x10,
                  local_118->blob_allocator);
      iVar44 = -100;
      if ((this_00->data != (void *)0x0) &&
         (uVar49 = (ulong)this_00->c, this_00->cstep * uVar49 != 0)) {
        for (lVar50 = 0; auVar53 = (undefined1  [64])m_1._0_64_, lVar50 < (int)uVar49;
            lVar50 = lVar50 + 1) {
          m_1.refcount = (int *)0x0;
          m_1.data = (void **)((long)&(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->data +
                              uVar47 * lVar50 *
                              (long)bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          m_1.elemsize = (size_t)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage;
          m_1._28_36_ = auVar53._28_36_;
          m_1.elempack = iVar36;
          auVar35 = (undefined1  [64])m_1._0_64_;
          m_1._40_24_ = auVar53._40_24_;
          m_1._0_32_ = auVar35._0_32_;
          m_1.allocator = pAVar10;
          auVar34 = (undefined1  [40])m_1._0_40_;
          m_1.w = uVar26;
          m_1.h = uVar27;
          m_1.d = 1;
          m_1._60_4_ = auVar53._60_4_;
          m_1.c = uVar28;
          m_1.dims = uVar25 + -1;
          m_1._0_44_ = CONCAT440(m_1.dims,auVar34);
          m_1.cstep = ((long)bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage *
                       (long)(int)uVar27 * (long)(int)uVar26 + 0xfU & 0xfffffffffffffff0) /
                      (ulong)bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
          if (uVar25 == 4) {
            m_1.cstep = (long)(int)uVar27 * (long)(int)uVar26;
          }
          bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)this_00->elemsize;
          bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(this_00->cstep * lVar50 *
                         (long)bottom_blobs_unpacked.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + (long)this_00->data);
          bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          crop_pack16_avx512(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
          uVar49 = (ulong)(uint)this_00->c;
        }
        iVar44 = 0;
      }
    }
    piVar38 = (int *)CONCAT44(bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._4_4_,
                              bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._0_4_);
    if (piVar38 == (int *)0x0) {
      return iVar44;
    }
    LOCK();
    *piVar38 = *piVar38 + -1;
    UNLOCK();
    if (*piVar38 != 0) {
      return iVar44;
    }
    if (pAVar10 != (Allocator *)0x0) {
      (*pAVar10->_vptr_Allocator[3])();
      return iVar44;
    }
    goto LAB_00258d35;
  }
  switch(iVar44) {
  case 1:
    uVar48 = _outw & 7;
    bVar52 = (_outw & 3U) == 0;
    iVar36 = 8;
    if (uVar48 != 0) {
      iVar36 = (uint)bVar52 * 3 + 1;
    }
    sVar39 = bVar52 * '\x02';
    if (uVar48 == 0) {
      sVar39 = 3;
    }
    uVar49 = (long)_outw % (long)iVar36;
    if (local_1e4 != _outw / iVar36 || uVar48 != 0) {
      if (((_outw | _woffset) & 7U) == 0) {
        Mat::create(this_00,_outw / iVar36,(local_108 >> 3) << sVar39,8,local_118->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          crop_pack8_avx(pMVar6,this_00,0,_woffset / 8);
          return 0;
        }
        return -100;
      }
      goto switchD_002561a9_default;
    }
    if (this_00 == pMVar6) {
      return 0;
    }
    piVar38 = pMVar6->refcount;
    if (piVar38 != (int *)0x0) {
      LOCK();
      *piVar38 = *piVar38 + 1;
      UNLOCK();
    }
    piVar38 = this_00->refcount;
    if (piVar38 == (int *)0x0) goto LAB_00257b6d;
    LOCK();
    *piVar38 = *piVar38 + -1;
    UNLOCK();
    if (*piVar38 != 0) goto LAB_00257b6d;
    pvVar8 = this_00->data;
    pAVar10 = this_00->allocator;
joined_r0x0025623b:
    uVar49 = uVar49 & 0xffffffff;
joined_r0x0025623b:
    if (pAVar10 == (Allocator *)0x0) {
      free(pvVar8);
    }
    else {
      (*pAVar10->_vptr_Allocator[3])(pAVar10,pvVar8,uVar49);
    }
LAB_00257b6d:
    this_00->cstep = 0;
    this_00->data = (void *)0x0;
    this_00->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&this_00->refcount + 4) = (undefined1  [16])0x0;
    this_00->c = 0;
    this_00->dims = 0;
    this_00->w = 0;
    this_00->h = 0;
    this_00->d = 0;
    piVar38 = pMVar6->refcount;
    this_00->data = pMVar6->data;
    this_00->refcount = piVar38;
    this_00->elemsize = pMVar6->elemsize;
    this_00->elempack = pMVar6->elempack;
    this_00->allocator = pMVar6->allocator;
    iVar36 = pMVar6->w;
    iVar40 = pMVar6->h;
    iVar44 = pMVar6->d;
    this_00->dims = pMVar6->dims;
    this_00->w = iVar36;
    this_00->h = iVar40;
    this_00->d = iVar44;
    this_00->c = pMVar6->c;
    this_00->cstep = pMVar6->cstep;
    return 0;
  case 2:
    sVar39 = ((_outh & 3U) == 0) * '\x02';
    if ((_outh & 7U) == 0) {
      sVar39 = 3;
    }
    if (_outw == local_1e4) {
      iVar40 = 8;
      if ((_outh & 7U) != 0) {
        iVar40 = (uint)((_outh & 3U) == 0) * 3 + 1;
      }
      uVar49 = (long)_outh % (long)iVar40;
      if (((_outh & 7U) == 0) && (_outh / iVar40 == iVar36)) {
        if (this_00 == pMVar6) {
          return 0;
        }
        piVar38 = pMVar6->refcount;
        if (piVar38 != (int *)0x0) {
          LOCK();
          *piVar38 = *piVar38 + 1;
          UNLOCK();
        }
        piVar38 = this_00->refcount;
        if (piVar38 == (int *)0x0) goto LAB_00257b6d;
        LOCK();
        *piVar38 = *piVar38 + -1;
        UNLOCK();
        if (*piVar38 != 0) goto LAB_00257b6d;
        pvVar8 = this_00->data;
        pAVar10 = this_00->allocator;
        goto joined_r0x0025623b;
      }
    }
    if (((_hoffset | _outh) & 7U) == 0) {
      Mat::create(this_00,_outw,_outh / 8,(local_108 >> 3) << sVar39,8,local_118->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        crop_pack8_avx(pMVar6,this_00,_hoffset / 8,_woffset);
        return 0;
      }
      return -100;
    }
switchD_002561a9_default:
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&bottom_blobs_unpacked,
               ((long)(local_f8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(local_f8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start) / 0x48,(allocator_type *)&bottom_blob_shapes)
    ;
    uVar47 = 0xffffffffffffffff;
    lVar50 = 0;
    do {
      pMVar7 = (local_f8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar47 = uVar47 + 1;
      if ((ulong)(((long)(local_f8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar7) / 0x48) <= uVar47
         ) {
        iVar36 = Crop::forward(&this->super_Crop,&bottom_blobs_unpacked,top_blobs,local_118);
        goto LAB_00257b38;
      }
      piVar38 = *(int **)((long)&pMVar7->refcount + lVar50);
      puVar1 = (undefined8 *)((long)&pMVar7->data + lVar50);
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*puVar1;
      uVar46 = puVar1[1];
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = (undefined4)uVar46;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)uVar46 >> 0x20);
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)((long)&pMVar7->elemsize + lVar50);
      uVar5 = *(undefined4 *)((long)&pMVar7->elempack + lVar50);
      plVar9 = *(long **)((long)&pMVar7->allocator + lVar50);
      puVar1 = (undefined8 *)((long)&pMVar7->dims + lVar50);
      uVar46 = *puVar1;
      uVar31 = puVar1[1];
      iVar36 = *(int *)((long)&pMVar7->c + lVar50);
      lVar37 = *(long *)((long)&pMVar7->cstep + lVar50);
      if (piVar38 != (int *)0x0) {
        LOCK();
        *piVar38 = *piVar38 + 1;
        UNLOCK();
      }
      if (local_11c == 1) {
LAB_00257a09:
        pMVar7 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pMVar6 = (Mat *)((long)&(bottom_blobs_unpacked.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_start)->data + lVar50);
        bVar52 = true;
        piVar38 = (int *)CONCAT44(bottom_blob_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_finish._4_4_,
                                  bottom_blob_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_finish._0_4_);
        if (pMVar6 != (Mat *)&bottom_blob_shapes) {
          if (piVar38 != (int *)0x0) {
            LOCK();
            *piVar38 = *piVar38 + 1;
            UNLOCK();
          }
          piVar38 = *(int **)((long)&(bottom_blobs_unpacked.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->refcount + lVar50);
          if (piVar38 != (int *)0x0) {
            LOCK();
            *piVar38 = *piVar38 + -1;
            UNLOCK();
            if (*piVar38 == 0) {
              plVar11 = *(long **)((long)&(bottom_blobs_unpacked.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->allocator +
                                  lVar50);
              if (plVar11 == (long *)0x0) {
                free(*(void **)((long)&(bottom_blobs_unpacked.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->data + lVar50));
              }
              else {
                (**(code **)(*plVar11 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&pMVar7->cstep + lVar50) = 0;
          *(undefined1 (*) [16])((long)&pMVar6->refcount + 4) = (undefined1  [16])0x0;
          pMVar6->data = (void *)0x0;
          pMVar6->refcount = (int *)0x0;
          *(undefined4 *)((long)&pMVar7->c + lVar50) = 0;
          *(undefined1 (*) [16])((long)&pMVar7->dims + lVar50) = (undefined1  [16])0x0;
          piVar38 = (int *)CONCAT44(bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._0_4_);
          puVar1 = (undefined8 *)((long)&pMVar7->data + lVar50);
          *puVar1 = bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar1[1] = CONCAT44(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish._4_4_,
                               bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish._0_4_);
          *(pointer *)((long)&pMVar7->elemsize + lVar50) =
               bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          *(undefined4 *)((long)&pMVar7->elempack + lVar50) = uVar5;
          *(long **)((long)&pMVar7->allocator + lVar50) = plVar9;
          puVar1 = (undefined8 *)((long)&pMVar7->dims + lVar50);
          *puVar1 = uVar46;
          puVar1[1] = uVar31;
          *(int *)((long)&pMVar7->c + lVar50) = iVar36;
          *(long *)((long)&pMVar7->cstep + lVar50) = lVar37;
        }
      }
      else {
        auVar53 = vmovdqu64_avx512f((undefined1  [64])*local_118);
        auVar53 = vmovdqu64_avx512f(auVar53);
        m_1._16_48_ = auVar53._16_48_;
        m_1.data = auVar53._0_8_;
        m_1.refcount = (int *)local_118->workspace_allocator;
        convert_packing((Mat *)((long)&((local_f8->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_start)->data + lVar50),
                        (Mat *)&bottom_blob_shapes,1,(Option *)&m_1);
        if ((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start != (pointer)0x0) && (iVar36 * lVar37 != 0))
        goto LAB_00257a09;
        piVar38 = (int *)CONCAT44(bottom_blob_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_finish._4_4_,
                                  bottom_blob_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_finish._0_4_);
        bVar52 = false;
      }
      if (piVar38 != (int *)0x0) {
        LOCK();
        *piVar38 = *piVar38 + -1;
        UNLOCK();
        if (*piVar38 == 0) {
          if (plVar9 == (long *)0x0) {
            free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start);
          }
          else {
            (**(code **)(*plVar9 + 0x18))();
          }
        }
      }
      lVar50 = lVar50 + 0x48;
    } while (bVar52);
    iVar36 = -100;
LAB_00257b38:
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs_unpacked);
    return iVar36;
  case 3:
    break;
  case 4:
    uVar47 = local_108 >> 3;
    sVar39 = ((_outc & 3U) == 0) * '\x02';
    if ((_outc & 7U) == 0) {
      sVar39 = 3;
    }
    if (iVar40 == _outd && (iVar36 == _outh && local_1e4 == _outw)) {
      iVar44 = 8;
      if ((_outc & 7U) != 0) {
        iVar44 = (uint)((_outc & 3U) == 0) * 3 + 1;
      }
      uVar49 = (long)_outc % (long)iVar44 & 0xffffffff;
      if (((_outc & 7U) == 0) && (_outc / iVar44 == local_120)) {
        if (this_00 == pMVar6) {
          return 0;
        }
        piVar38 = pMVar6->refcount;
        if (piVar38 != (int *)0x0) {
          LOCK();
          *piVar38 = *piVar38 + 1;
          UNLOCK();
        }
        piVar38 = this_00->refcount;
        if (piVar38 == (int *)0x0) goto LAB_00257b6d;
        LOCK();
        *piVar38 = *piVar38 + -1;
        UNLOCK();
        if (*piVar38 != 0) goto LAB_00257b6d;
        pvVar8 = this_00->data;
        pAVar10 = this_00->allocator;
        goto joined_r0x0025623b;
      }
    }
    if (((_coffset | _outc) & 7U) != 0) goto switchD_002561a9_default;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pMVar6->elemsize;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)(_coffset / 8) * pMVar6->cstep *
                   (long)bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + (long)pMVar6->data);
    iVar43 = pMVar6->elempack;
    pAVar10 = pMVar6->allocator;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    uVar17 = pMVar6->w;
    uVar18 = pMVar6->h;
    uVar49 = ((long)pMVar6->d *
              (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage *
              (long)pMVar6->h * (long)pMVar6->w + 0xfU & 0xfffffffffffffff0) /
             (ulong)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar40 != _outd || (iVar36 != _outh || local_1e4 != _outw)) {
LAB_00258b38:
      Mat::create(this_00,_outw,_outh,_outd,_outc / 8,uVar47 << sVar39,8,local_118->blob_allocator);
      iVar44 = -100;
      if ((this_00->data != (void *)0x0) &&
         (uVar47 = (ulong)this_00->c, this_00->cstep * uVar47 != 0)) {
        for (lVar50 = 0; lVar50 < (int)uVar47; lVar50 = lVar50 + 1) {
          for (lVar37 = 0; auVar53 = (undefined1  [64])m_1._0_64_, lVar37 < _outd;
              lVar37 = lVar37 + 1) {
            m_1.cstep = (long)(int)uVar18 * (long)(int)uVar17;
            m_1.refcount = (int *)0x0;
            m_1.data = (void *)((long)&(bottom_blob_shapes.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->data +
                               (long)(_doffset + (int)lVar37) *
                               (long)bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage * m_1.cstep +
                               uVar49 * lVar50 *
                               (long)bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
            m_1.elemsize = (size_t)bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage;
            m_1._28_36_ = auVar53._28_36_;
            m_1.elempack = iVar43;
            m_1.allocator = pAVar10;
            m_1.dims = 2;
            m_1.w = uVar17;
            m_1.h = uVar18;
            m_1._60_4_ = auVar53._60_4_;
            m_1.d = 1;
            m_1.c = 1;
            bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)this_00->elemsize;
            bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((long)this_00->data +
                          lVar37 * (long)bottom_blobs_unpacked.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage *
                          (long)this_00->h * (long)this_00->w +
                          this_00->cstep * lVar50 *
                          (long)bottom_blobs_unpacked.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
            bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            crop_pack8_avx(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
          }
          uVar47 = (ulong)(uint)this_00->c;
        }
        iVar44 = 0;
      }
    }
    else {
      Mat::clone(&m_1,(__fn *)&bottom_blob_shapes,local_118->blob_allocator,_outd,
                 (void *)(ulong)(uint)_outh);
      piVar38 = m_1.refcount;
      auVar53 = (undefined1  [64])m_1._0_64_;
      if (this_00 != &m_1) {
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + 1;
          UNLOCK();
        }
        piVar38 = this_00->refcount;
        if (piVar38 != (int *)0x0) {
          LOCK();
          *piVar38 = *piVar38 + -1;
          UNLOCK();
          if (*piVar38 == 0) {
            if (this_00->allocator == (Allocator *)0x0) {
              free(this_00->data);
            }
            else {
              (*this_00->allocator->_vptr_Allocator[3])();
            }
          }
        }
        auVar53 = (undefined1  [64])m_1._0_64_;
        this_00->data = m_1.data;
        this_00->refcount = m_1.refcount;
        this_00->elemsize = m_1.elemsize;
        this_00->elempack = m_1.elempack;
        this_00->allocator = m_1.allocator;
        this_00->dims = m_1.dims;
        this_00->w = m_1.w;
        this_00->h = m_1.h;
        this_00->d = m_1.d;
        m_1.c = auVar53._56_4_;
        this_00->c = m_1.c;
        this_00->cstep = m_1.cstep;
        piVar38 = m_1.refcount;
      }
      m_1._0_64_ = auVar53;
      if (piVar38 != (int *)0x0) {
        LOCK();
        *piVar38 = *piVar38 + -1;
        UNLOCK();
        if (*piVar38 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar44 = -100;
      if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0))
      goto LAB_00258b38;
    }
    piVar38 = (int *)CONCAT44(bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._4_4_,
                              bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._0_4_);
    if (piVar38 == (int *)0x0) {
      return iVar44;
    }
    LOCK();
    *piVar38 = *piVar38 + -1;
    UNLOCK();
    if (*piVar38 != 0) {
      return iVar44;
    }
    if (pAVar10 != (Allocator *)0x0) {
      (*pAVar10->_vptr_Allocator[3])();
      return iVar44;
    }
    goto LAB_00258d35;
  default:
    goto switchD_002561a9_default;
  }
  uVar47 = local_108 >> 3;
  sVar39 = ((_outc & 3U) == 0) * '\x02';
  if ((_outc & 7U) == 0) {
    sVar39 = 3;
  }
  if (iVar36 == _outh && local_1e4 == _outw) {
    iVar40 = 8;
    if ((_outc & 7U) != 0) {
      iVar40 = (uint)((_outc & 3U) == 0) * 3 + 1;
    }
    uVar49 = (long)_outc % (long)iVar40;
    if (((_outc & 7U) == 0) && (_outc / iVar40 == local_120)) {
      if (this_00 == pMVar6) {
        return 0;
      }
      piVar38 = pMVar6->refcount;
      if (piVar38 != (int *)0x0) {
        LOCK();
        *piVar38 = *piVar38 + 1;
        UNLOCK();
      }
      piVar38 = this_00->refcount;
      if (piVar38 == (int *)0x0) goto LAB_00257b6d;
      LOCK();
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if (*piVar38 != 0) goto LAB_00257b6d;
      pvVar8 = this_00->data;
      pAVar10 = this_00->allocator;
      goto joined_r0x0025623b;
    }
  }
  if (((_coffset | _outc) & 7U) != 0) goto switchD_002561a9_default;
  iVar44 = (int)((long)_outc / 8);
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pMVar6->elemsize;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)(_coffset / 8) * pMVar6->cstep *
                 (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + (long)pMVar6->data);
  iVar40 = pMVar6->elempack;
  pAVar10 = pMVar6->allocator;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  uVar13 = pMVar6->dims;
  uVar14 = pMVar6->w;
  uVar15 = pMVar6->h;
  uVar16 = pMVar6->d;
  uVar49 = ((long)pMVar6->d *
            (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage *
            (long)pMVar6->h * (long)pMVar6->w + 0xfU & 0xfffffffffffffff0) /
           (ulong)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (iVar36 != _outh || local_1e4 != _outw) {
LAB_00258849:
    Mat::create(this_00,_outw,_outh,iVar44,uVar47 << sVar39,8,local_118->blob_allocator);
    iVar44 = -100;
    if ((this_00->data != (void *)0x0) && (uVar47 = (ulong)this_00->c, this_00->cstep * uVar47 != 0)
       ) {
      for (lVar50 = 0; auVar53 = (undefined1  [64])m_1._0_64_, lVar50 < (int)uVar47;
          lVar50 = lVar50 + 1) {
        m_1.refcount = (int *)0x0;
        m_1.data = (void **)((long)&(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->data +
                            uVar49 * lVar50 *
                            (long)bottom_blob_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
        m_1.elemsize = (size_t)bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
        m_1._28_36_ = auVar53._28_36_;
        m_1.elempack = iVar40;
        auVar35 = (undefined1  [64])m_1._0_64_;
        m_1._40_24_ = auVar53._40_24_;
        m_1._0_32_ = auVar35._0_32_;
        m_1.allocator = pAVar10;
        auVar34 = (undefined1  [40])m_1._0_40_;
        m_1.w = uVar14;
        m_1.h = uVar15;
        m_1.d = 1;
        m_1._60_4_ = auVar53._60_4_;
        m_1.c = uVar16;
        m_1.dims = uVar13 + -1;
        m_1._0_44_ = CONCAT440(m_1.dims,auVar34);
        m_1.cstep = ((long)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage *
                     (long)(int)uVar15 * (long)(int)uVar14 + 0xfU & 0xfffffffffffffff0) /
                    (ulong)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
        if (uVar13 == 4) {
          m_1.cstep = (long)(int)uVar15 * (long)(int)uVar14;
        }
        bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)this_00->elemsize;
        bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(this_00->cstep * lVar50 *
                       (long)bottom_blobs_unpacked.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + (long)this_00->data);
        bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        crop_pack8_avx(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
        uVar47 = (ulong)(uint)this_00->c;
      }
      iVar44 = 0;
    }
  }
  else {
    Mat::clone(&m_1,(__fn *)&bottom_blob_shapes,local_118->blob_allocator,_outh,
               (void *)((long)_outc / 8 & 0xffffffff));
    piVar38 = m_1.refcount;
    auVar53 = (undefined1  [64])m_1._0_64_;
    if (this_00 != &m_1) {
      if (m_1.refcount != (int *)0x0) {
        LOCK();
        *m_1.refcount = *m_1.refcount + 1;
        UNLOCK();
      }
      piVar38 = this_00->refcount;
      if (piVar38 != (int *)0x0) {
        LOCK();
        *piVar38 = *piVar38 + -1;
        UNLOCK();
        if (*piVar38 == 0) {
          if (this_00->allocator == (Allocator *)0x0) {
            free(this_00->data);
          }
          else {
            (*this_00->allocator->_vptr_Allocator[3])();
          }
        }
      }
      auVar53 = (undefined1  [64])m_1._0_64_;
      this_00->data = m_1.data;
      this_00->refcount = m_1.refcount;
      this_00->elemsize = m_1.elemsize;
      this_00->elempack = m_1.elempack;
      this_00->allocator = m_1.allocator;
      this_00->dims = m_1.dims;
      this_00->w = m_1.w;
      this_00->h = m_1.h;
      this_00->d = m_1.d;
      m_1.c = auVar53._56_4_;
      this_00->c = m_1.c;
      this_00->cstep = m_1.cstep;
      piVar38 = m_1.refcount;
    }
    m_1._0_64_ = auVar53;
    if (piVar38 != (int *)0x0) {
      LOCK();
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if (*piVar38 == 0) {
        if (m_1.allocator == (Allocator *)0x0) {
          free(m_1.data);
        }
        else {
          (*(m_1.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar44 = -100;
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      iVar44 = _outc / 8;
      goto LAB_00258849;
    }
  }
  piVar38 = (int *)CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_,
                            bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_4_);
  if (piVar38 == (int *)0x0) {
    return iVar44;
  }
  LOCK();
  *piVar38 = *piVar38 + -1;
  UNLOCK();
  if (*piVar38 != 0) {
    return iVar44;
  }
  if (pAVar10 != (Allocator *)0x0) {
    (*pAVar10->_vptr_Allocator[3])();
    return iVar44;
  }
LAB_00258d35:
  free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start);
  return iVar44;
}

Assistant:

int Crop_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
    int _woffset, _hoffset, _doffset, _coffset;
    int _outw, _outh, _outd, _outc;
    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blob_shapes(bottom_blobs.size());
        for (size_t i = 0; i < bottom_blobs.size(); i++)
        {
            bottom_blob_shapes[i] = bottom_blobs[i].shape();
        }
        eval_crop_expr(bottom_blob_shapes, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    std::vector<Mat> bottom_blobs_unpacked(bottom_blobs.size());
    for (size_t i = 0; i < bottom_blobs.size(); i++)
    {
        Mat bottom_blob_unpacked = bottom_blobs[i];
        if (elempack != 1)
        {
            Option opt_pack1 = opt;
            opt_pack1.blob_allocator = opt.workspace_allocator;

            convert_packing(bottom_blobs[i], bottom_blob_unpacked, 1, opt_pack1);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        bottom_blobs_unpacked[i] = bottom_blob_unpacked;
    }

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}